

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int archive_compressor_xz_open(archive_write_filter *f)

{
  private_data_conflict7 *data_00;
  size_t sVar1;
  lzma_bool lVar2;
  int iVar3;
  ulong uVar4;
  uchar *puVar5;
  lzma_mode lVar6;
  option_value *val;
  size_t bpb;
  size_t bs;
  int ret;
  private_data_conflict7 *data;
  archive_write_filter *f_local;
  
  data_00 = (private_data_conflict7 *)f->data;
  f_local._4_4_ = __archive_write_open_filter(f->next_filter);
  if (f_local._4_4_ == 0) {
    if (data_00->compressed == (uchar *)0x0) {
      bpb = 0x10000;
      sVar1 = bpb;
      if (f->archive->magic == 0xb0c5c0de) {
        iVar3 = archive_write_get_bytes_per_block(f->archive);
        uVar4 = (ulong)iVar3;
        sVar1 = uVar4;
        if ((uVar4 < 0x10001) && (sVar1 = bpb, uVar4 != 0)) {
          sVar1 = 0x10000 - 0x10000U % uVar4;
        }
      }
      bpb = sVar1;
      data_00->compressed_buffer_size = bpb;
      puVar5 = (uchar *)malloc(data_00->compressed_buffer_size);
      data_00->compressed = puVar5;
      if (data_00->compressed == (uchar *)0x0) {
        archive_set_error(f->archive,0xc,"Can\'t allocate data for compression buffer");
        return -0x1e;
      }
    }
    f->write = archive_compressor_xz_write;
    if (f->code == 9) {
      iVar3 = data_00->compression_level;
      (data_00->lzma_opt).dict_size = option_values[iVar3].dict_size;
      (data_00->lzma_opt).preset_dict = (uint8_t *)0x0;
      (data_00->lzma_opt).preset_dict_size = 0;
      (data_00->lzma_opt).lc = 3;
      (data_00->lzma_opt).lp = 0;
      (data_00->lzma_opt).pb = 2;
      lVar6 = LZMA_MODE_NORMAL;
      if (data_00->compression_level < 3) {
        lVar6 = LZMA_MODE_FAST;
      }
      (data_00->lzma_opt).mode = lVar6;
      (data_00->lzma_opt).nice_len = option_values[iVar3].nice_len;
      (data_00->lzma_opt).mf = option_values[iVar3].mf;
      (data_00->lzma_opt).depth = 0;
      data_00->lzmafilters[0].id = 0x4000000000000001;
      data_00->lzmafilters[0].options = &data_00->lzma_opt;
      data_00->lzmafilters[1].id = 0xffffffffffffffff;
    }
    else {
      lVar2 = lzma_lzma_preset(&data_00->lzma_opt,data_00->compression_level);
      if (lVar2 != '\0') {
        archive_set_error(f->archive,-1,"Internal error initializing compression library");
      }
      data_00->lzmafilters[0].id = 0x21;
      data_00->lzmafilters[0].options = &data_00->lzma_opt;
      data_00->lzmafilters[1].id = 0xffffffffffffffff;
    }
    iVar3 = archive_compressor_xz_init_stream(f,data_00);
    if (iVar3 == 0) {
      f->data = data_00;
      f_local._4_4_ = 0;
    }
    else {
      f_local._4_4_ = -0x1e;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int
archive_compressor_xz_open(struct archive_write_filter *f)
{
	struct private_data *data = f->data;
	int ret;

	ret = __archive_write_open_filter(f->next_filter);
	if (ret != ARCHIVE_OK)
		return (ret);

	if (data->compressed == NULL) {
		size_t bs = 65536, bpb;
		if (f->archive->magic == ARCHIVE_WRITE_MAGIC) {
			/* Buffer size should be a multiple number of the of bytes
			 * per block for performance. */
			bpb = archive_write_get_bytes_per_block(f->archive);
			if (bpb > bs)
				bs = bpb;
			else if (bpb != 0)
				bs -= bs % bpb;
		}
		data->compressed_buffer_size = bs;
		data->compressed
		    = (unsigned char *)malloc(data->compressed_buffer_size);
		if (data->compressed == NULL) {
			archive_set_error(f->archive, ENOMEM,
			    "Can't allocate data for compression buffer");
			return (ARCHIVE_FATAL);
		}
	}

	f->write = archive_compressor_xz_write;

	/* Initialize compression library. */
	if (f->code == ARCHIVE_FILTER_LZIP) {
		const struct option_value *val =
		    &option_values[data->compression_level];

		data->lzma_opt.dict_size = val->dict_size;
		data->lzma_opt.preset_dict = NULL;
		data->lzma_opt.preset_dict_size = 0;
		data->lzma_opt.lc = LZMA_LC_DEFAULT;
		data->lzma_opt.lp = LZMA_LP_DEFAULT;
		data->lzma_opt.pb = LZMA_PB_DEFAULT;
		data->lzma_opt.mode =
		    data->compression_level<= 2? LZMA_MODE_FAST:LZMA_MODE_NORMAL;
		data->lzma_opt.nice_len = val->nice_len;
		data->lzma_opt.mf = val->mf;
		data->lzma_opt.depth = 0;
		data->lzmafilters[0].id = LZMA_FILTER_LZMA1;
		data->lzmafilters[0].options = &data->lzma_opt;
		data->lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */
	} else {
		if (lzma_lzma_preset(&data->lzma_opt, data->compression_level)) {
			archive_set_error(f->archive, ARCHIVE_ERRNO_MISC,
			    "Internal error initializing compression library");
		}
		data->lzmafilters[0].id = LZMA_FILTER_LZMA2;
		data->lzmafilters[0].options = &data->lzma_opt;
		data->lzmafilters[1].id = LZMA_VLI_UNKNOWN;/* Terminate */
	}
	ret = archive_compressor_xz_init_stream(f, data);
	if (ret == LZMA_OK) {
		f->data = data;
		return (0);
	}
	return (ARCHIVE_FATAL);
}